

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
          (reporter<boost::ext::ut::v1_1_8::printer> *this,exception exception)

{
  size_t *psVar1;
  printer *this_00;
  
  std::operator<<((ostream *)&(this->printer_).field_0x40,"\n  ");
  this_00 = printer::operator<<(&this->printer_,&(this->printer_).colors_.fail);
  std::operator<<((ostream *)&this_00->field_0x40,"Unexpected exception with message:\n");
  std::operator<<((ostream *)&this_00->field_0x40,exception.msg);
  printer::operator<<(this_00,(basic_string_view<char,_std::char_traits<char>_> *)&this->printer_);
  psVar1 = &(this->asserts_).fail;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

auto on(events::exception exception) -> void {
      printer_ << "\n  " << printer_.colors().fail
               << "Unexpected exception with message:\n"
               << exception.what() << printer_.colors().none;
      ++asserts_.fail;
    }